

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

iter_type __thiscall
booster::locale::impl_icu::num_parse<wchar_t>::do_real_get<long>
          (num_parse<wchar_t> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,long *val)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  int_type iVar4;
  int_type iVar5;
  int_type iVar6;
  int iVar7;
  int_type iVar8;
  long *plVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar10;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  streambuf_type *psVar11;
  ulong uVar12;
  iter_type __beg;
  iter_type iVar13;
  undefined1 auVar14 [16];
  iter_type iVar15;
  iter_type __end;
  _func_int **local_78;
  base_formatter local_68;
  num_parse<wchar_t> *local_60;
  string_type tmp;
  cast_type value;
  
  __end._M_sbuf = end._M_sbuf;
  psVar11 = in._M_sbuf;
  iVar8 = end._M_c;
  iVar6 = in._M_c;
  local_60 = this;
  plVar9 = (long *)__dynamic_cast(ios,&std::ios_base::typeinfo,&std::wistream::typeinfo,
                                  0xffffffffffffffff);
  bVar3 = true;
  if (plVar9 == (long *)0x0) {
    local_78 = (_func_int **)0x0;
    bVar2 = false;
  }
  else {
    bVar3 = num_base::use_parent<long>(ios,0);
    if (bVar3) {
      local_78 = (_func_int **)0x0;
      bVar2 = false;
      bVar3 = true;
    }
    else {
      formatter<wchar_t>::create
                ((formatter<wchar_t> *)&local_68,ios,&local_60->loc_,&local_60->enc_);
      local_78 = local_68._vptr_base_formatter;
      local_68._vptr_base_formatter = (_func_int **)0x0;
      bVar3 = local_78 == (_func_int **)0x0;
      bVar2 = true;
    }
  }
  if ((bVar2) && (local_68._vptr_base_formatter != (_func_int **)0x0)) {
    (**(code **)(*local_68._vptr_base_formatter + 8))();
  }
  if (!bVar3) {
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = L'\0';
    std::__cxx11::wstring::reserve((ulong)&tmp);
    while( true ) {
      iVar4 = iVar6;
      if (iVar6 == 0xffffffff && psVar11 != (streambuf_type *)0x0) {
        if (*(int_type **)(psVar11 + 0x10) < *(int_type **)(psVar11 + 0x18)) {
          iVar4 = **(int_type **)(psVar11 + 0x10);
        }
        else {
          iVar4 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
        }
        if (iVar4 == 0xffffffff) {
          psVar11 = (streambuf_type *)0x0;
        }
      }
      iVar5 = iVar8;
      if (__end._M_sbuf != (streambuf_type *)0x0 && iVar8 == 0xffffffff) {
        if (*(int_type **)(__end._M_sbuf + 0x10) < *(int_type **)(__end._M_sbuf + 0x18)) {
          iVar5 = **(int_type **)(__end._M_sbuf + 0x10);
        }
        else {
          iVar5 = (**(code **)(*(long *)__end._M_sbuf + 0x48))(__end._M_sbuf);
        }
        if (iVar5 == 0xffffffff) {
          __end._M_sbuf = (streambuf_type *)0x0;
        }
      }
      if ((iVar5 == 0xffffffff) == (iVar4 == 0xffffffff)) break;
      iVar4 = iVar6;
      if (psVar11 != (streambuf_type *)0x0 && iVar6 == 0xffffffff) {
        if (*(int_type **)(psVar11 + 0x10) < *(int_type **)(psVar11 + 0x18)) {
          iVar4 = **(int_type **)(psVar11 + 0x10);
        }
        else {
          iVar4 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
        }
        if (iVar4 == 0xffffffff) {
          psVar11 = (streambuf_type *)0x0;
        }
      }
      if (iVar4 != 0x7f && 0x1f < iVar4 - 1) break;
      if (*(ulong *)(psVar11 + 0x10) < *(ulong *)(psVar11 + 0x18)) {
        *(ulong *)(psVar11 + 0x10) = *(ulong *)(psVar11 + 0x10) + 4;
        iVar6 = 0xffffffff;
      }
      else {
        iVar6 = 0xffffffff;
        (**(code **)(*(long *)psVar11 + 0x50))(psVar11);
      }
    }
    do {
      if (0xfff < tmp._M_string_length) goto LAB_00191dfd;
      iVar4 = iVar6;
      if (iVar6 == 0xffffffff && psVar11 != (streambuf_type *)0x0) {
        if (*(int_type **)(psVar11 + 0x10) < *(int_type **)(psVar11 + 0x18)) {
          iVar4 = **(int_type **)(psVar11 + 0x10);
        }
        else {
          iVar4 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
        }
        if (iVar4 == 0xffffffff) {
          psVar11 = (streambuf_type *)0x0;
        }
      }
      iVar5 = iVar8;
      if (__end._M_sbuf != (streambuf_type *)0x0 && iVar8 == 0xffffffff) {
        if (*(int_type **)(__end._M_sbuf + 0x10) < *(int_type **)(__end._M_sbuf + 0x18)) {
          iVar5 = **(int_type **)(__end._M_sbuf + 0x10);
        }
        else {
          iVar5 = (**(code **)(*(long *)__end._M_sbuf + 0x48))(__end._M_sbuf);
        }
        if (iVar5 == 0xffffffff) {
          __end._M_sbuf = (streambuf_type *)0x0;
        }
      }
      if ((iVar4 == 0xffffffff) == (iVar5 == 0xffffffff)) goto LAB_00191dfd;
      if (psVar11 != (streambuf_type *)0x0 && iVar6 == 0xffffffff) {
        if (*(int_type **)(psVar11 + 0x10) < *(int_type **)(psVar11 + 0x18)) {
          iVar6 = **(int_type **)(psVar11 + 0x10);
        }
        else {
          iVar6 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
        }
        if (iVar6 == 0xffffffff) {
          psVar11 = (streambuf_type *)0x0;
        }
      }
      if (iVar6 == 10) goto LAB_00191dfd;
      piVar1 = *(int **)(psVar11 + 0x10);
      if (piVar1 < *(int **)(psVar11 + 0x18)) {
        iVar7 = *piVar1;
        *(int **)(psVar11 + 0x10) = piVar1 + 1;
      }
      else {
        iVar7 = (**(code **)(*(long *)psVar11 + 0x50))(psVar11);
      }
      if (((psVar11 != (streambuf_type *)0x0) && (iVar7 == -1)) &&
         (*(ulong *)(psVar11 + 0x18) <= *(ulong *)(psVar11 + 0x10))) {
        (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
      }
      iVar6 = 0xffffffff;
      std::__cxx11::wstring::push_back((wchar_t)&tmp);
    } while( true );
  }
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)SUB128(in._0_12_,0);
  __beg._M_c = SUB124(in._0_12_,8);
  __end._8_8_ = end._8_8_ & 0xffffffff;
  iVar13 = std::num_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
           _M_extract_int_abi_cxx11_<long>
                     ((num_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>
                       *)local_60,__beg,__end,ios,err,val);
  iVar6 = iVar13._M_c;
LAB_00191edf:
  if (local_78 != (_func_int **)0x0) {
    (**(code **)(*local_78 + 8))(local_78);
  }
  iVar15._M_c = iVar6;
  iVar15._M_sbuf = iVar13._M_sbuf;
  iVar15._12_4_ = 0;
  return iVar15;
LAB_00191dfd:
  auVar14 = (**(code **)(*local_78 + 0x30))(local_78,&tmp,&value);
  uVar10 = auVar14._8_8_;
  uVar12 = tmp._M_string_length;
  if (auVar14._0_8_ == 0) {
    *(undefined1 *)err = (char)*err | _S_failbit;
  }
  else {
    *val = value;
  }
  for (; auVar14._0_8_ < uVar12; uVar12 = uVar12 - 1) {
    std::wistream::putback((wchar_t)plVar9);
    uVar10 = extraout_RDX;
  }
  psVar11 = *(streambuf_type **)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0xe8);
  if (psVar11 == (streambuf_type *)0x0) {
    bVar3 = true;
  }
  else {
    if (*(int **)(psVar11 + 0x10) < *(int **)(psVar11 + 0x18)) {
      iVar7 = **(int **)(psVar11 + 0x10);
    }
    else {
      iVar7 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
      uVar10 = extraout_RDX_01;
    }
    bVar3 = iVar7 == -1;
    if (bVar3) {
      psVar11 = (streambuf_type *)0x0;
    }
  }
  if (__end._M_sbuf != (streambuf_type *)0x0 && iVar8 == 0xffffffff) {
    if (*(int_type **)(__end._M_sbuf + 0x10) < *(int_type **)(__end._M_sbuf + 0x18)) {
      iVar8 = **(int_type **)(__end._M_sbuf + 0x10);
    }
    else {
      iVar8 = (**(code **)(*(long *)__end._M_sbuf + 0x48))(__end._M_sbuf);
      uVar10 = extraout_RDX_02;
    }
  }
  if ((bool)(bVar3 ^ iVar8 != 0xffffffff)) {
    *(undefined1 *)err = (char)*err | _S_eofbit;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)tmp._M_dataplus._M_p != &tmp.field_2) {
    operator_delete(tmp._M_dataplus._M_p);
    uVar10 = extraout_RDX_00;
  }
  iVar13._8_8_ = uVar10;
  iVar13._M_sbuf = psVar11;
  iVar6 = 0xffffffff;
  goto LAB_00191edf;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }